

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O3

void __thiscall smf::MidiMessage::makeMetaMessage(MidiMessage *this,int mnum,string *data)

{
  pointer *ppuVar1;
  iterator iVar2;
  byte local_1a;
  uchar local_19;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,0);
  local_19 = 0xff;
  iVar2._M_current =
       (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
              (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,iVar2,&local_19);
    iVar2._M_current =
         (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar2._M_current = 0xff;
    iVar2._M_current =
         (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  local_1a = (byte)mnum & 0x7f;
  if (iVar2._M_current ==
      (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
              (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,iVar2,&local_1a);
  }
  else {
    *iVar2._M_current = local_1a;
    ppuVar1 = &(this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  setMetaContent(this,data);
  return;
}

Assistant:

void MidiMessage::makeMetaMessage(int mnum, const std::string& data) {
	resize(0);
	push_back(0xff);
	push_back(mnum & 0x7f); // max meta-message number is 0x7f.
	setMetaContent(data);
}